

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

char * __thiscall Pathie::Path::basename(Path *this,char *__filename)

{
  bool bVar1;
  string local_e0 [32];
  string local_c0 [32];
  long local_a0;
  size_t pos;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  char *local_18;
  Path *this_local;
  
  local_18 = __filename;
  this_local = this;
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          __filename,".");
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,".",&local_39);
    Path(this,(string *)local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            __filename,"..");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"..",&local_71);
      Path(this,(string *)local_70);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    else {
      bVar1 = is_root((Path *)__filename);
      if (bVar1) {
        std::__cxx11::string::string((string *)&pos,(string *)__filename);
        Path(this,(string *)&pos);
        std::__cxx11::string::~string((string *)&pos);
      }
      else {
        local_a0 = 0;
        local_a0 = std::__cxx11::string::rfind(__filename,0x11817c);
        if (local_a0 == -1) {
          std::__cxx11::string::string(local_e0,(string *)__filename);
          Path(this,(string *)local_e0);
          std::__cxx11::string::~string(local_e0);
        }
        else {
          std::__cxx11::string::substr((ulong)local_c0,(ulong)__filename);
          Path(this,local_c0);
          std::__cxx11::string::~string((string *)local_c0);
        }
      }
    }
  }
  return (char *)this;
}

Assistant:

Path Path::basename() const
{
  if (m_path == ".")
    return Path(".");
  else if (m_path == "..")
    return Path("..");
  else if (is_root())
    return Path(m_path);

  size_t pos = 0;
  if ((pos = m_path.rfind("/")) != string::npos) // Single = intended
    return Path(m_path.substr(pos + 1));
  else
    return Path(m_path);
}